

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

UVector * icu_63::ZoneMeta::createMetazoneMappings(UnicodeString *tzid)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  UResourceBundle *fillIn;
  UChar *pUVar4;
  undefined8 *buffer;
  UVector *pUVar5;
  UErrorCode *size;
  undefined1 *text;
  char *target;
  undefined1 *text_00;
  UErrorCode status;
  UnicodeString canonicalID;
  char tzKey [129];
  UErrorCode local_114;
  UVector *local_110;
  UDate local_108;
  UDate local_100;
  UnicodeString local_f8;
  char local_b8 [136];
  
  local_114 = U_ZERO_ERROR;
  local_f8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_f8.fUnion.fStackFields.fLengthAndFlags = 2;
  resB = ures_openDirect_63((char *)0x0,"metaZones",&local_114);
  ures_getByKey_63(resB,"metazoneInfo",resB,&local_114);
  getCanonicalCLDRID(tzid,&local_f8,&local_114);
  if (local_114 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < local_f8.fUnion.fStackFields.fLengthAndFlags) {
      local_f8.fUnion.fFields.fLength = (int)local_f8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    target = local_b8;
    iVar3 = UnicodeString::extract
                      (&local_f8,0,local_f8.fUnion.fFields.fLength,target,0x81,kInvariant);
    local_b8[iVar3] = '\0';
    do {
      if (*target == '/') {
        *target = ':';
      }
      else if (*target == '\0') goto LAB_002095ee;
      target = target + 1;
    } while( true );
  }
LAB_002097be:
  pUVar5 = (UVector *)0x0;
LAB_002097c1:
  ures_close_63(resB);
  UnicodeString::~UnicodeString(&local_f8);
  return pUVar5;
LAB_002095ee:
  ures_getByKey_63(resB,local_b8,resB,&local_114);
  if (local_114 < U_ILLEGAL_ARGUMENT_ERROR) {
    fillIn = (UResourceBundle *)0x0;
    local_110 = (UVector *)0x0;
    do {
      UVar2 = ures_hasNext_63(resB);
      if (UVar2 == '\0') break;
      fillIn = ures_getNextResource_63(resB,fillIn,&local_114);
      pUVar4 = ures_getStringByIndex_63(fillIn,0,(int32_t *)0x0,&local_114);
      iVar3 = ures_getSize_63(fillIn);
      text = gDefaultFrom;
      text_00 = gDefaultTo;
      if (iVar3 == 3) {
        text = (undefined1 *)ures_getStringByIndex_63(fillIn,1,(int32_t *)0x0,&local_114);
        text_00 = (undefined1 *)ures_getStringByIndex_63(fillIn,2,(int32_t *)0x0,&local_114);
      }
      if (local_114 < U_ILLEGAL_ARGUMENT_ERROR) {
        local_100 = parseDate((UChar *)text,&local_114);
        size = &local_114;
        local_108 = parseDate((UChar *)text_00,&local_114);
        if (U_ZERO_ERROR < local_114) goto LAB_002096c7;
        buffer = (undefined8 *)uprv_malloc_63(0x18);
        if (buffer == (undefined8 *)0x0) {
          local_114 = U_MEMORY_ALLOCATION_ERROR;
          bVar1 = true;
        }
        else {
          *buffer = pUVar4;
          buffer[1] = local_100;
          buffer[2] = local_108;
          pUVar5 = local_110;
          if (local_110 == (UVector *)0x0) {
            pUVar5 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
            if (pUVar5 == (UVector *)0x0) {
              pUVar5 = (UVector *)0x0;
            }
            else {
              UVector::UVector(pUVar5,deleteOlsonToMetaMappingEntry,(UElementsAreEqual *)0x0,
                               &local_114);
            }
            if (U_ZERO_ERROR < local_114) {
              if (pUVar5 != (UVector *)0x0) {
                (*(pUVar5->super_UObject)._vptr_UObject[1])(pUVar5);
              }
              uprv_free_63(buffer);
              bVar1 = true;
              local_110 = (UVector *)0x0;
              goto LAB_002096d1;
            }
          }
          local_110 = pUVar5;
          UVector::addElement(pUVar5,buffer,&local_114);
          bVar1 = U_ZERO_ERROR < local_114;
        }
      }
      else {
LAB_002096c7:
        local_114 = U_ZERO_ERROR;
        bVar1 = false;
      }
LAB_002096d1:
    } while (!bVar1);
    ures_close_63(fillIn);
    pUVar5 = local_110;
    if ((local_114 < U_ILLEGAL_ARGUMENT_ERROR) || (local_110 == (UVector *)0x0)) goto LAB_002097c1;
    (*(local_110->super_UObject)._vptr_UObject[1])(local_110);
  }
  goto LAB_002097be;
}

Assistant:

UVector*
ZoneMeta::createMetazoneMappings(const UnicodeString &tzid) {
    UVector *mzMappings = NULL;
    UErrorCode status = U_ZERO_ERROR;

    UnicodeString canonicalID;
    UResourceBundle *rb = ures_openDirect(NULL, gMetaZones, &status);
    ures_getByKey(rb, gMetazoneInfo, rb, &status);
    getCanonicalCLDRID(tzid, canonicalID, status);

    if (U_SUCCESS(status)) {
        char tzKey[ZID_KEY_MAX + 1];
        int32_t tzKeyLen = canonicalID.extract(0, canonicalID.length(), tzKey, sizeof(tzKey), US_INV);
        tzKey[tzKeyLen] = 0;

        // tzid keys are using ':' as separators
        char *p = tzKey;
        while (*p) {
            if (*p == '/') {
                *p = ':';
            }
            p++;
        }

        ures_getByKey(rb, tzKey, rb, &status);

        if (U_SUCCESS(status)) {
            UResourceBundle *mz = NULL;
            while (ures_hasNext(rb)) {
                mz = ures_getNextResource(rb, mz, &status);

                const UChar *mz_name = ures_getStringByIndex(mz, 0, NULL, &status);
                const UChar *mz_from = gDefaultFrom;
                const UChar *mz_to = gDefaultTo;

                if (ures_getSize(mz) == 3) {
                    mz_from = ures_getStringByIndex(mz, 1, NULL, &status);
                    mz_to   = ures_getStringByIndex(mz, 2, NULL, &status);
                }

                if(U_FAILURE(status)){
                    status = U_ZERO_ERROR;
                    continue;
                }
                // We do not want to use SimpleDateformat to parse boundary dates,
                // because this code could be triggered by the initialization code
                // used by SimpleDateFormat.
                UDate from = parseDate(mz_from, status);
                UDate to = parseDate(mz_to, status);
                if (U_FAILURE(status)) {
                    status = U_ZERO_ERROR;
                    continue;
                }

                OlsonToMetaMappingEntry *entry = (OlsonToMetaMappingEntry*)uprv_malloc(sizeof(OlsonToMetaMappingEntry));
                if (entry == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                entry->mzid = mz_name;
                entry->from = from;
                entry->to = to;

                if (mzMappings == NULL) {
                    mzMappings = new UVector(deleteOlsonToMetaMappingEntry, NULL, status);
                    if (U_FAILURE(status)) {
                        delete mzMappings;
                        mzMappings = NULL;
                        uprv_free(entry);
                        break;
                    }
                }

                mzMappings->addElement(entry, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
            ures_close(mz);
            if (U_FAILURE(status)) {
                if (mzMappings != NULL) {
                    delete mzMappings;
                    mzMappings = NULL;
                }
            }
        }
    }
    ures_close(rb);
    return mzMappings;
}